

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O0

void __thiscall QSslServerPrivate::checkClientHelloAndContinue(QSslServerPrivate *this)

{
  byte bVar1;
  QSslSocket *this_00;
  long lVar2;
  RestrictedBool RVar3;
  QSslServerPrivate *in_RDI;
  long in_FS_OFFSET;
  char CLIENT_HELLO;
  bool foundData;
  QSslSocket *socket;
  QSslServer *q;
  iterator it;
  char byte;
  SocketData *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  Connection local_48;
  Connection local_40;
  piter local_38;
  QSslSocket *local_28;
  piter local_20;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QObject::sender();
  this_00 = qobject_cast<QSslSocket*>((QObject *)0x3b1811);
  if ((this_00 != (QSslSocket *)0x0) &&
     (lVar2 = (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0xa0))(),
     0 < lVar2)) {
    local_9 = '\0';
    lVar2 = QIODevice::peek((char *)this_00,(longlong)&local_9);
    if (lVar2 == 1) {
      local_20.bucket = 0xaaaaaaaaaaaaaaaa;
      local_20.d = (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
                   0xaaaaaaaaaaaaaaaa;
      local_28 = this_00;
      local_20 = (piter)QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::find
                                  ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)
                                   in_RDI,(unsigned_long_long *)in_stack_ffffffffffffff88);
      local_38 = (piter)QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::end
                                  ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)
                                   CONCAT17(in_stack_ffffffffffffff9f,
                                            CONCAT16(in_stack_ffffffffffffff9e,
                                                     in_stack_ffffffffffffff98)));
      bVar1 = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator!=
                        ((iterator *)
                         CONCAT17(in_stack_ffffffffffffff9f,
                                  CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
                         (iterator *)in_RDI);
      if ((bool)bVar1) {
        QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
                  ((iterator *)0x3b18f3);
        RVar3 = QMetaObject::Connection::operator_cast_to__((Connection *)in_RDI);
        if (RVar3 != 0xffffffffffffffff) {
          in_stack_ffffffffffffff88 =
               QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
                         ((iterator *)0x3b190b);
          QMetaObject::Connection::Connection(&local_48);
          std::exchange<QMetaObject::Connection,QMetaObject::Connection>
                    ((Connection *)
                     CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
                     (Connection *)in_RDI);
          QObject::disconnect(&local_40);
          QMetaObject::Connection::~Connection(&local_40);
          QMetaObject::Connection::~Connection(&local_48);
        }
      }
      if (local_9 == '\x16') {
        if ((bVar1 & 1) != 0) {
          QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::operator->
                    ((iterator *)0x3b1984);
          std::__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<QTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x3b1990);
          QTimer::start();
        }
        QSslSocket::startServerEncryption(this_00);
        QSslServer::startedEncryptionHandshake
                  ((QSslServer *)0x3b19b1,(QSslSocket *)in_stack_ffffffffffffff88);
      }
      else {
        (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0x100))();
        QObject::deleteLater();
      }
    }
    else {
      QObject::deleteLater();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslServerPrivate::checkClientHelloAndContinue()
{
    Q_Q(QSslServer);
    QSslSocket *socket = qobject_cast<QSslSocket *>(q->sender());
    if (Q_UNLIKELY(!socket) || socket->bytesAvailable() <= 0)
        return;

    char byte = '\0';
    if (socket->peek(&byte, 1) != 1) {
        socket->deleteLater();
        return;
    }

    auto it = socketData.find(quintptr(socket));
    const bool foundData = it != socketData.end();
    if (foundData && it->readyReadConnection)
        QObject::disconnect(std::exchange(it->readyReadConnection, {}));

    constexpr char CLIENT_HELLO = 0x16;
    if (byte != CLIENT_HELLO) {
        socket->disconnectFromHost();
        socket->deleteLater();
        return;
    }

    // Be nice and restart the timeout timer since some progress was made
    if (foundData)
        it->timeoutTimer->start();

    socket->startServerEncryption();
    Q_EMIT q->startedEncryptionHandshake(socket);
}